

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_Node * getNodeType(UA_Server *server,UA_Node *node)

{
  UA_ReferenceNode *pUVar1;
  UA_Boolean UVar2;
  uint uVar3;
  UA_Node *pUVar4;
  UA_Boolean UVar5;
  long lVar6;
  long lVar7;
  size_t sVar8;
  bool bVar9;
  undefined1 local_58 [8];
  UA_NodeId parentRef;
  
  uVar3 = node->nodeClass - UA_NODECLASS_OBJECT;
  if (uVar3 < 0x40) {
    if ((0x8000000080008000U >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
      if ((3UL >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
        return (UA_Node *)0x0;
      }
      UVar5 = false;
      parentRef.namespaceIndex = 0x28;
      parentRef._2_2_ = 0;
    }
    else {
      UVar5 = true;
      parentRef.namespaceIndex = 0x2d;
      parentRef._2_2_ = 0;
    }
    local_58._0_2_ = 0;
    local_58._4_4_ = UA_NODEIDTYPE_NUMERIC;
    sVar8 = node->referencesSize;
    lVar6 = -0x20;
    lVar7 = 0;
    parentRef.identifier.string.data = (UA_Byte *)node;
    while (bVar9 = sVar8 != 0, sVar8 = sVar8 - 1, bVar9) {
      pUVar1 = node->references;
      if ((UVar5 == (&pUVar1->isInverse)[lVar7]) &&
         (UVar2 = UA_NodeId_equal((UA_NodeId *)
                                  ((long)&(pUVar1->referenceTypeId).namespaceIndex + lVar7),
                                  (UA_NodeId *)local_58),
         node = (UA_Node *)parentRef.identifier.string.data, UVar2)) {
        pUVar4 = UA_NodeStore_get(server->nodestore,(UA_NodeId *)((long)pUVar1 - lVar6));
        return pUVar4;
      }
      lVar6 = lVar6 + -0x50;
      lVar7 = lVar7 + 0x50;
    }
  }
  return (UA_Node *)0x0;
}

Assistant:

const UA_Node *
getNodeType(UA_Server *server, const UA_Node *node) {
    /* The reference to the parent is different for variable and variabletype */
    UA_NodeId parentRef;
    UA_Boolean inverse;
    if(node->nodeClass == UA_NODECLASS_VARIABLE ||
       node->nodeClass == UA_NODECLASS_OBJECT) {
        parentRef = UA_NODEID_NUMERIC(0, UA_NS0ID_HASTYPEDEFINITION);
        inverse = false;
    } else if(node->nodeClass == UA_NODECLASS_VARIABLETYPE ||
              /* node->nodeClass == UA_NODECLASS_OBJECTTYPE || // objecttype may have multiple parents */
              node->nodeClass == UA_NODECLASS_REFERENCETYPE ||
              node->nodeClass == UA_NODECLASS_DATATYPE) {
        parentRef = UA_NODEID_NUMERIC(0, UA_NS0ID_HASSUBTYPE);
        inverse = true;
    } else {
        return NULL;
    }

    /* stop at the first matching candidate */
    UA_NodeId *parentId = NULL;
    for(size_t i = 0; i < node->referencesSize; ++i) {
        if(node->references[i].isInverse == inverse &&
           UA_NodeId_equal(&node->references[i].referenceTypeId, &parentRef)) {
            parentId = &node->references[i].targetId.nodeId;
            break;
        }
    }

    if(!parentId)
        return NULL;
    return UA_NodeStore_get(server->nodestore, parentId);
}